

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::LdexpCaseInstance::compare
          (LdexpCaseInstance *this,void **inputs,void **outputs)

{
  float fVar1;
  float fVar2;
  pointer pSVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  ostringstream *this_00;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  deUint32 u32;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar3 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = *(uint *)((long)&(pSVar3->varType).m_data + 4);
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (0 < (int)uVar4) {
    fVar12 = (float)~(-1 << (0x17 - (&DAT_00b5b32c)[(ulong)uVar8 * 4] & 0x1f));
    uVar14 = 0;
    bVar15 = false;
    do {
      fVar2 = *(float *)((long)*inputs + uVar14 * 4);
      iVar7 = *(int *)((long)inputs[1] + uVar14 * 4);
      if (fVar2 == 0.0 && iVar7 == 0) {
        fVar10 = (float)((uint)fVar2 & 0x80000000);
      }
      else {
        bVar16 = ((uint)fVar2 & 0x7f800000) != 0;
        uVar11 = (uint)fVar2 & 0x7fffff;
        uVar8 = uVar11 + 0x800000;
        iVar5 = ((uint)fVar2 >> 0x17 & 0xff) - 0x7f;
        if (uVar11 != 0 && !bVar16) {
          uVar8 = uVar11;
          iVar5 = -0x7e;
        }
        iVar5 = iVar5 + iVar7;
        uVar9 = 0;
        if (fVar2 != 0.0) {
          uVar9 = uVar8;
        }
        if (NAN(fVar2)) {
          uVar9 = uVar8;
        }
        uVar8 = 0;
        if ((uVar9 != 0 || iVar5 != 0) &&
           ((fVar2 != 0.0 && (uVar11 == 0 || bVar16) || (uVar8 = 0, iVar5 != -0x7e)))) {
          uVar8 = iVar5 * 0x800000 + 0x3f800000;
        }
        fVar10 = (float)(uVar9 & 0x7fffff | (uint)fVar2 & 0x80000000 | uVar8);
      }
      fVar1 = *(float *)((long)*outputs + uVar14 * 4);
      if (((fVar1 == 0.0) && (fVar13 = fVar10, !NAN(fVar1))) ||
         ((fVar10 == 0.0 && (fVar13 = fVar1, !NAN(fVar10))))) {
        fVar13 = ABS(fVar13);
      }
      else {
        fVar13 = (float)((int)fVar10 - (int)fVar1);
        if ((uint)fVar10 < (uint)fVar1) {
          fVar13 = (float)-((int)fVar10 - (int)fVar1);
        }
      }
      if ((uint)fVar12 < (uint)fVar13) {
        iVar5 = ((uint)fVar2 >> 0x17 & 0xff) - 0x7f;
        iVar7 = -0x7e;
        if (((uint)fVar2 & 0x7fffff) == 0) {
          iVar7 = iVar5;
        }
        if (((uint)fVar2 & 0x7f800000) != 0) {
          iVar7 = iVar5;
        }
        this_00 = &(this->super_CommonFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        poVar6 = (ostream *)std::ostream::operator<<(this_00,(int)uVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] = ",4);
        local_34.value = fVar10;
        poVar6 = anon_unknown_0::operator<<(poVar6,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", (exp = ",9);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") with ULP threshold ",0x15);
        local_40.value = (deUint64)(uint)fVar12;
        poVar6 = tcu::Format::Hex<8UL>::toStream(&local_40,poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", got ULP diff ",0xf);
        local_40.value = (deUint64)(uint)fVar13;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar6);
        return bVar15;
      }
      uVar14 = uVar14 + 1;
      bVar15 = uVar4 <= uVar14;
    } while (uVar14 != uVar4);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);
		const deUint32			maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const int		in1			= ((const int*)inputs[1])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const float		refOut0		= ldexp(in0, in1);
			const deUint32	ulpDiff		= getUlpDiffIgnoreZeroSign(out0, refOut0);

			const int		inExp		= tcu::Float32(in0).exponent();

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(refOut0) << ", (exp = " << inExp << ") with ULP threshold "
						  << tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}